

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage.cpp
# Opt level: O2

void do_mirror_data<unsigned_long_long>
               (QImageData *dst,QImageData *src,int dstX0,int dstY0,int dstXIncr,int dstYIncr,int w,
               int h)

{
  uchar *puVar1;
  undefined8 uVar2;
  long lVar3;
  ulong uVar4;
  uchar *puVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int srcY;
  
  if (dst == src) {
    uVar10 = (uint)((long)w / 2);
    uVar7 = h;
    uVar11 = uVar10;
    if (dstY0 != 0) {
      uVar7 = h / 2;
      uVar11 = w;
    }
    if (dstX0 == 0) {
      uVar11 = w;
    }
    uVar12 = 0;
    uVar4 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar4 = uVar12;
    }
    lVar3 = (long)dstY0;
    uVar8 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar8 = uVar12;
    }
    for (; uVar12 != uVar8; uVar12 = uVar12 + 1) {
      lVar6 = src->bytes_per_line * uVar12;
      puVar1 = src->data;
      puVar5 = dst->data + dst->bytes_per_line * lVar3 + (long)dstX0 * 8;
      for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
        uVar2 = *(undefined8 *)(puVar1 + uVar9 * 8 + lVar6);
        *(undefined8 *)(puVar1 + uVar9 * 8 + lVar6) = *(undefined8 *)puVar5;
        *(undefined8 *)puVar5 = uVar2;
        puVar5 = puVar5 + (long)dstXIncr * 8;
      }
      lVar3 = lVar3 + dstYIncr;
    }
    if (((dstY0 != 0) && (dstX0 != 0)) && ((h & 1U) != 0)) {
      lVar3 = (long)(h / 2) * src->bytes_per_line;
      puVar1 = src->data;
      uVar12 = 0;
      uVar4 = (long)w / 2 & 0xffffffff;
      if ((int)uVar10 < 1) {
        uVar4 = uVar12;
      }
      puVar5 = puVar1 + lVar3 + (long)dstX0 * 8;
      for (; uVar4 != uVar12; uVar12 = uVar12 + 1) {
        uVar2 = *(undefined8 *)(puVar1 + uVar12 * 8 + lVar3);
        *(undefined8 *)(puVar1 + uVar12 * 8 + lVar3) = *(undefined8 *)puVar5;
        *(undefined8 *)puVar5 = uVar2;
        puVar5 = puVar5 + (long)dstXIncr * 8;
      }
    }
  }
  else {
    uVar4 = 0;
    if (w < 1) {
      w = 0;
    }
    lVar3 = (long)dstY0;
    if (h < 1) {
      h = 0;
    }
    for (; uVar4 != (uint)h; uVar4 = uVar4 + 1) {
      puVar5 = dst->data + dst->bytes_per_line * lVar3 + (long)dstX0 * 8;
      lVar6 = src->bytes_per_line;
      puVar1 = src->data;
      for (uVar12 = 0; (uint)w != uVar12; uVar12 = uVar12 + 1) {
        *(undefined8 *)puVar5 = *(undefined8 *)(puVar1 + uVar12 * 8 + lVar6 * uVar4);
        puVar5 = puVar5 + (long)dstXIncr * 8;
      }
      lVar3 = lVar3 + dstYIncr;
    }
  }
  return;
}

Assistant:

inline void do_mirror_data(QImageData *dst, QImageData *src,
                                             int dstX0, int dstY0,
                                             int dstXIncr, int dstYIncr,
                                             int w, int h)
{
    if (dst == src) {
        // When mirroring in-place, stop in the middle for one of the directions, since we
        // are swapping the bytes instead of merely copying.
        const int srcXEnd = (dstX0 && !dstY0) ? w / 2 : w;
        const int srcYEnd = dstY0 ? h / 2 : h;
        for (int srcY = 0, dstY = dstY0; srcY < srcYEnd; ++srcY, dstY += dstYIncr) {
            T *srcPtr = (T *) (src->data + srcY * src->bytes_per_line);
            T *dstPtr = (T *) (dst->data + dstY * dst->bytes_per_line);
            for (int srcX = 0, dstX = dstX0; srcX < srcXEnd; ++srcX, dstX += dstXIncr)
                std::swap(srcPtr[srcX], dstPtr[dstX]);
        }
        // If mirroring both ways, the middle line needs to be mirrored horizontally only.
        if (dstX0 && dstY0 && (h & 1)) {
            int srcY = h / 2;
            int srcXEnd2 = w / 2;
            T *srcPtr = (T *) (src->data + srcY * src->bytes_per_line);
            for (int srcX = 0, dstX = dstX0; srcX < srcXEnd2; ++srcX, dstX += dstXIncr)
                std::swap(srcPtr[srcX], srcPtr[dstX]);
        }
    } else {
        for (int srcY = 0, dstY = dstY0; srcY < h; ++srcY, dstY += dstYIncr) {
            T *srcPtr = (T *) (src->data + srcY * src->bytes_per_line);
            T *dstPtr = (T *) (dst->data + dstY * dst->bytes_per_line);
            for (int srcX = 0, dstX = dstX0; srcX < w; ++srcX, dstX += dstXIncr)
                dstPtr[dstX] = srcPtr[srcX];
        }
    }
}